

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3PromoteSegments(Fts3Table *p,sqlite3_int64 iAbsLevel,sqlite3_int64 nByte)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  sqlite3_stmt *pStmt;
  sqlite3_stmt **pp;
  long in_RDX;
  long in_RSI;
  long in_FS_OFFSET;
  int iIdx;
  i64 nLimit;
  i64 iLast;
  int bOk;
  int rc;
  sqlite3_stmt *pUpdate2;
  sqlite3_stmt *pUpdate1;
  i64 dummy;
  i64 nSize;
  sqlite3_stmt *pRange;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  sqlite3_stmt *in_stack_ffffffffffffff88;
  sqlite3_stmt *in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 uVar5;
  sqlite3_stmt **in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb0;
  uint uVar6;
  sqlite3_stmt *local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = fts3SqlStmt((Fts3Table *)(ulong)in_stack_ffffffffffffffb0,
                      (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),in_stack_ffffffffffffffa0,
                      (sqlite3_value **)
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (iVar2 == 0) {
    uVar6 = 0;
    pStmt = (sqlite3_stmt *)((in_RSI / 0x400 + 1) * 0x400 + -1);
    pp = (sqlite3_stmt **)((in_RDX * 3) / 2);
    sqlite3_bind_int64(in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    sqlite3_bind_int64(in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    iVar3 = sqlite3_step(pStmt);
    if (iVar3 == 100) {
      fts3ReadEndBlockField
                ((sqlite3_stmt *)CONCAT44(iVar2,uVar6),(int)((ulong)pStmt >> 0x20),(i64 *)pp,
                 (i64 *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      uVar6 = 0;
    }
    iVar2 = sqlite3_reset(in_stack_ffffffffffffff90);
    if (uVar6 != 0) {
      uVar5 = 0;
      local_28 = (sqlite3_stmt *)0x0;
      if (iVar2 == 0) {
        iVar2 = fts3SqlStmt((Fts3Table *)(ulong)uVar6,(int)((ulong)pStmt >> 0x20),pp,
                            (sqlite3_value **)(ulong)in_stack_ffffffffffffff98);
      }
      if (iVar2 == 0) {
        iVar2 = fts3SqlStmt((Fts3Table *)(ulong)uVar6,(int)((ulong)pStmt >> 0x20),pp,
                            (sqlite3_value **)CONCAT44(uVar5,in_stack_ffffffffffffff98));
      }
      iVar3 = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
      if (iVar2 == 0) {
        sqlite3_bind_int64(in_stack_ffffffffffffff90,iVar3,
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        do {
          iVar3 = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
          iVar4 = sqlite3_step(pStmt);
          if (iVar4 != 100) goto LAB_002565cc;
          sqlite3_bind_int((sqlite3_stmt *)
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
          in_stack_ffffffffffffff88 = local_28;
          sqlite3_column_int((sqlite3_stmt *)
                             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                             in_stack_ffffffffffffff7c);
          sqlite3_bind_int((sqlite3_stmt *)
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
          in_stack_ffffffffffffff90 = local_28;
          sqlite3_column_int((sqlite3_stmt *)
                             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                             in_stack_ffffffffffffff7c);
          sqlite3_bind_int((sqlite3_stmt *)
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
          sqlite3_step(pStmt);
          iVar2 = sqlite3_reset(in_stack_ffffffffffffff90);
          iVar3 = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
        } while (iVar2 == 0);
        sqlite3_reset(in_stack_ffffffffffffff90);
      }
LAB_002565cc:
      if (iVar2 == 0) {
        iVar2 = sqlite3_reset(in_stack_ffffffffffffff90);
      }
      if (iVar2 == 0) {
        sqlite3_bind_int64(in_stack_ffffffffffffff90,iVar3,
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        sqlite3_step(pStmt);
        iVar2 = sqlite3_reset(in_stack_ffffffffffffff90);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int fts3PromoteSegments(
  Fts3Table *p,                   /* FTS table handle */
  sqlite3_int64 iAbsLevel,        /* Absolute level just updated */
  sqlite3_int64 nByte             /* Size of new segment at iAbsLevel */
){
  int rc = SQLITE_OK;
  sqlite3_stmt *pRange;

  rc = fts3SqlStmt(p, SQL_SELECT_LEVEL_RANGE2, &pRange, 0);

  if( rc==SQLITE_OK ){
    int bOk = 0;
    i64 iLast = (iAbsLevel/FTS3_SEGDIR_MAXLEVEL + 1) * FTS3_SEGDIR_MAXLEVEL - 1;
    i64 nLimit = (nByte*3)/2;

    /* Loop through all entries in the %_segdir table corresponding to
    ** segments in this index on levels greater than iAbsLevel. If there is
    ** at least one such segment, and it is possible to determine that all
    ** such segments are smaller than nLimit bytes in size, they will be
    ** promoted to level iAbsLevel.  */
    sqlite3_bind_int64(pRange, 1, iAbsLevel+1);
    sqlite3_bind_int64(pRange, 2, iLast);
    while( SQLITE_ROW==sqlite3_step(pRange) ){
      i64 nSize = 0, dummy;
      fts3ReadEndBlockField(pRange, 2, &dummy, &nSize);
      if( nSize<=0 || nSize>nLimit ){
        /* If nSize==0, then the %_segdir.end_block field does not not
        ** contain a size value. This happens if it was written by an
        ** old version of FTS. In this case it is not possible to determine
        ** the size of the segment, and so segment promotion does not
        ** take place.  */
        bOk = 0;
        break;
      }
      bOk = 1;
    }
    rc = sqlite3_reset(pRange);

    if( bOk ){
      int iIdx = 0;
      sqlite3_stmt *pUpdate1 = 0;
      sqlite3_stmt *pUpdate2 = 0;

      if( rc==SQLITE_OK ){
        rc = fts3SqlStmt(p, SQL_UPDATE_LEVEL_IDX, &pUpdate1, 0);
      }
      if( rc==SQLITE_OK ){
        rc = fts3SqlStmt(p, SQL_UPDATE_LEVEL, &pUpdate2, 0);
      }

      if( rc==SQLITE_OK ){

        /* Loop through all %_segdir entries for segments in this index with
        ** levels equal to or greater than iAbsLevel. As each entry is visited,
        ** updated it to set (level = -1) and (idx = N), where N is 0 for the
        ** oldest segment in the range, 1 for the next oldest, and so on.
        **
        ** In other words, move all segments being promoted to level -1,
        ** setting the "idx" fields as appropriate to keep them in the same
        ** order. The contents of level -1 (which is never used, except
        ** transiently here), will be moved back to level iAbsLevel below.  */
        sqlite3_bind_int64(pRange, 1, iAbsLevel);
        while( SQLITE_ROW==sqlite3_step(pRange) ){
          sqlite3_bind_int(pUpdate1, 1, iIdx++);
          sqlite3_bind_int(pUpdate1, 2, sqlite3_column_int(pRange, 0));
          sqlite3_bind_int(pUpdate1, 3, sqlite3_column_int(pRange, 1));
          sqlite3_step(pUpdate1);
          rc = sqlite3_reset(pUpdate1);
          if( rc!=SQLITE_OK ){
            sqlite3_reset(pRange);
            break;
          }
        }
      }
      if( rc==SQLITE_OK ){
        rc = sqlite3_reset(pRange);
      }

      /* Move level -1 to level iAbsLevel */
      if( rc==SQLITE_OK ){
        sqlite3_bind_int64(pUpdate2, 1, iAbsLevel);
        sqlite3_step(pUpdate2);
        rc = sqlite3_reset(pUpdate2);
      }
    }
  }


  return rc;
}